

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O2

char * __thiscall xray_re::xr_reader::skip_sz(xr_reader *this)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  
  puVar2 = (this->field_2).m_p;
  puVar3 = puVar2;
  do {
    if (this->m_end <= puVar3) {
      __assert_fail("m_p < m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,0x78,"const char *xray_re::xr_reader::skip_sz()");
    }
    (this->field_2).m_p = puVar3 + 1;
    uVar1 = *puVar3;
    puVar3 = puVar3 + 1;
  } while (uVar1 != '\0');
  return (char *)puVar2;
}

Assistant:

const char* xr_reader::skip_sz()
{
	const uint8_t* p = m_p;
	while (m_p < m_end) {
		if (*m_p++ == 0)
			return reinterpret_cast<const char*>(p);
	}
	// always crash if no '\0' in the chunk
	xr_assert(m_p < m_end);
	return reinterpret_cast<const char*>(p);
}